

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

void avaluem(double *w,int N,int p,int q,double *phi,double *theta,int tval,double *a)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  void *__ptr;
  void *__ptr_00;
  long lVar4;
  void *__ptr_01;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  uint uVar20;
  double dVar21;
  int local_38;
  
  uVar3 = (ulong)tval;
  __ptr = malloc((long)N * 8);
  __ptr_00 = malloc(uVar3 << 3);
  uVar20 = q;
  if (q < p) {
    uVar20 = p;
  }
  iVar1 = tval + N;
  uVar2 = iVar1 + uVar20;
  lVar4 = (long)(int)uVar2;
  __ptr_01 = malloc(lVar4 * 8);
  uVar5 = 0;
  uVar6 = (ulong)(uint)N;
  if (N < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr + uVar5 * 8) = 0;
  }
  uVar5 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr_01 + uVar5 * 8) = 0;
  }
  iVar15 = 1;
  if (1 < iVar1) {
    iVar15 = iVar1;
  }
  for (uVar6 = 0; iVar15 - 1 != uVar6; uVar6 = uVar6 + 1) {
    a[uVar6] = 0.0;
  }
  uVar6 = 0;
  uVar5 = 0;
  if (0 < tval) {
    uVar5 = (ulong)(uint)tval;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined8 *)((long)__ptr_00 + uVar6 * 8) = 0;
  }
  uVar2 = ~uVar20 + N;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < p) {
    uVar7 = (ulong)(uint)p;
  }
  if (0 < q) {
    uVar6 = (ulong)(uint)q;
  }
  for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar18 = (ulong)uVar2;
    dVar21 = 0.0;
    for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
      dVar21 = dVar21 - phi[uVar17] * w[uVar18 + uVar17 + 1];
    }
    for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
      dVar21 = dVar21 + theta[uVar17] * *(double *)((long)__ptr + uVar17 * 8 + uVar18 * 8 + 8);
    }
    *(double *)((long)__ptr + uVar18 * 8) = dVar21 + w[uVar18];
  }
  pdVar12 = (double *)((long)__ptr_00 + -8);
  lVar16 = 0;
  pdVar8 = w;
  pvVar14 = __ptr;
  for (uVar18 = 0; uVar18 != uVar5; uVar18 = uVar18 + 1) {
    dVar21 = 0.0;
    pdVar10 = pdVar12;
    pdVar19 = pdVar8;
    for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
      pdVar13 = pdVar19;
      if ((long)(lVar16 + uVar17) < 0) {
        pdVar13 = pdVar10;
      }
      dVar21 = dVar21 - phi[uVar17] * *pdVar13;
      pdVar10 = pdVar10 + -1;
      pdVar19 = pdVar19 + 1;
    }
    for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
      if (-1 < (long)(lVar16 + uVar17)) {
        dVar21 = dVar21 + theta[uVar17] * *(double *)((long)pvVar14 + uVar17 * 8);
      }
    }
    *(double *)((long)__ptr_00 + uVar18 * 8) = -dVar21;
    pdVar12 = pdVar12 + 1;
    pdVar8 = pdVar8 + -1;
    lVar16 = lVar16 + -1;
    pvVar14 = (void *)((long)pvVar14 + -8);
  }
  iVar1 = uVar20 + tval;
  if (p < q) {
    p = q;
  }
  lVar16 = (long)p;
  local_38 = p + -1;
  lVar9 = lVar16;
  do {
    if (lVar4 <= lVar9) {
      iVar1 = 0;
      while (lVar16 = lVar16 + 1, lVar16 < lVar4) {
        a[iVar1] = *(double *)((long)__ptr_01 + lVar16 * 8);
        iVar1 = iVar1 + 1;
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      return;
    }
    dVar21 = 0.0;
    iVar15 = local_38;
    for (lVar11 = 0; uVar7 * 8 != lVar11; lVar11 = lVar11 + 8) {
      if (iVar15 < iVar1) {
        if ((int)uVar20 <= iVar15) {
          pdVar12 = (double *)((long)__ptr_00 + lVar11 + (long)(int)uVar3 * 8);
          goto LAB_00131a83;
        }
      }
      else {
        pdVar12 = w + (iVar15 - iVar1);
LAB_00131a83:
        dVar21 = dVar21 - *(double *)((long)phi + lVar11) * *pdVar12;
      }
      iVar15 = iVar15 + -1;
    }
    iVar15 = local_38;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if ((int)uVar20 <= iVar15) {
        dVar21 = dVar21 + theta[uVar5] * *(double *)((long)__ptr_01 + (long)iVar15 * 8);
      }
      iVar15 = iVar15 + -1;
    }
    if (lVar9 < iVar1) {
      if ((int)uVar20 <= lVar9) {
        pdVar12 = (double *)((long)__ptr_00 + (long)(iVar1 - (int)lVar9) * 8 + -8);
        goto LAB_00131af9;
      }
    }
    else {
      pdVar12 = w + ((int)lVar9 - iVar1);
LAB_00131af9:
      *(double *)((long)__ptr_01 + lVar9 * 8) = dVar21 + *pdVar12;
    }
    lVar9 = lVar9 + 1;
    uVar3 = (ulong)((int)uVar3 - 1);
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void avaluem(double *w,int N,int p, int q, double *phi,double *theta,int tval,double *a) {
	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));


	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}
/*
	for(i = 0; i < N;++i) {
		printf("%g \n",e[i]);
	}
*/

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}
/*
	for(i = 0; i < tval;++i) {
		printf("%g \n",w2[i]);
	}
*/


	newl = N + tval;
	

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}
		
		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}

	free(e);
	free(w2);
	free(alpha);
}